

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O2

int mbedtls_ecp_mul_restartable
              (mbedtls_ecp_group *grp,mbedtls_ecp_point *R,mbedtls_mpi *m,mbedtls_ecp_point *P,
              _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng,mbedtls_ecp_restart_ctx *rs_ctx
              )

{
  mbedtls_mpi *X;
  mbedtls_mpi *Y;
  mbedtls_mpi *B_00;
  byte *pbVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  mbedtls_ecp_point *P_00;
  ulong uVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  uchar swap;
  size_t sVar11;
  mbedtls_ecp_point *pmVar12;
  ulong uVar13;
  byte bVar14;
  mbedtls_ecp_point *R_00;
  ulong uVar15;
  uint uVar16;
  long lVar17;
  size_t sVar18;
  uint uVar19;
  byte bVar20;
  ulong uVar21;
  bool bVar22;
  mbedtls_mpi A;
  mbedtls_mpi AA;
  mbedtls_mpi BB;
  mbedtls_mpi local_1e0;
  mbedtls_mpi DA;
  mbedtls_mpi E;
  mbedtls_mpi B;
  mbedtls_mpi D;
  mbedtls_mpi C;
  mbedtls_mpi local_150;
  mbedtls_ecp_point RP;
  
  iVar3 = mbedtls_ecp_check_privkey(grp,m);
  if (iVar3 != 0) {
    return iVar3;
  }
  iVar3 = mbedtls_ecp_check_pubkey(grp,P);
  if (iVar3 != 0) {
    return iVar3;
  }
  if ((grp->G).X.p == (mbedtls_mpi_uint *)0x0) {
    return -0x4f80;
  }
  if ((grp->G).Y.p == (mbedtls_mpi_uint *)0x0) {
    mbedtls_ecp_point_init(&RP);
    mbedtls_mpi_init(&local_150);
    iVar3 = mbedtls_mpi_copy(&local_150,&P->X);
    if (((iVar3 == 0) && (iVar3 = mbedtls_ecp_copy(&RP,P), iVar3 == 0)) &&
       (iVar3 = mbedtls_mpi_lset(&R->X,1), iVar3 == 0)) {
      X = &R->Z;
      iVar3 = mbedtls_mpi_lset(X,0);
      if (iVar3 == 0) {
        mbedtls_mpi_free(&R->Y);
        Y = &grp->P;
        do {
          iVar3 = mbedtls_mpi_cmp_mpi(&RP.X,Y);
          if (iVar3 < 0) {
            if ((f_rng == (_func_int_void_ptr_uchar_ptr_size_t *)0x0) ||
               (iVar3 = ecp_randomize_mxz(grp,&RP,f_rng,p_rng), iVar3 == 0)) {
              sVar11 = mbedtls_mpi_bitlen(m);
              goto LAB_00127a82;
            }
            break;
          }
          iVar3 = mbedtls_mpi_sub_abs(&RP.X,&RP.X,Y);
        } while (iVar3 == 0);
      }
    }
LAB_00127fea:
    mbedtls_ecp_point_free(&RP);
    mbedtls_mpi_free(&local_150);
    if (iVar3 != 0) {
      return iVar3;
    }
    if ((grp->G).X.p == (mbedtls_mpi_uint *)0x0) {
      return 0;
    }
    if ((grp->G).Y.p == (mbedtls_mpi_uint *)0x0) {
      return 0;
    }
  }
  iVar3 = mbedtls_mpi_cmp_mpi(&P->Y,&(grp->G).Y);
  if (iVar3 == 0) {
    iVar3 = mbedtls_mpi_cmp_mpi(&P->X,&(grp->G).X);
    bVar22 = iVar3 == 0;
  }
  else {
    bVar22 = false;
  }
  uVar6 = grp->nbits;
  bVar8 = (bVar22 + '\x01') - (uVar6 < 0x180) | 4;
  bVar10 = 2;
  if (bVar8 < uVar6) {
    bVar10 = bVar8;
  }
  uVar15 = (ulong)bVar10;
  uVar7 = 1;
  uVar16 = 1 << ((byte)(bVar10 - 1) & 0x1f);
  uVar21 = (uVar6 + uVar15) - 1;
  uVar6 = uVar21 / uVar15;
  bVar8 = (byte)uVar16;
  if ((bVar22 == false) || (P_00 = grp->T, P_00 == (mbedtls_ecp_point *)0x0)) {
    P_00 = (mbedtls_ecp_point *)calloc((ulong)uVar16,0x48);
    if (P_00 == (mbedtls_ecp_point *)0x0) {
      iVar3 = -0x4d80;
      P_00 = (mbedtls_ecp_point *)0x0;
    }
    else {
      for (bVar20 = 0; bVar20 < uVar16; bVar20 = bVar20 + 1) {
        mbedtls_ecp_point_init(P_00 + bVar20);
      }
      iVar3 = mbedtls_ecp_copy(P_00,P);
      if (iVar3 == 0) {
        uVar13 = 0;
LAB_001276d1:
        if ((bVar10 - 1) * uVar6 - uVar13 == 0) {
          uVar5 = uVar16 & 0xff;
          sVar11 = 0;
          while( true ) {
            uVar19 = (uint)(uVar7 & 0xff);
            if (uVar5 <= uVar19) break;
            *(mbedtls_ecp_point **)(&RP.X.s + sVar11 * 2) = P_00 + (uVar7 & 0xff);
            sVar11 = sVar11 + 1;
            uVar7 = (ulong)(uVar19 * 2);
          }
          iVar3 = ecp_normalize_jac_many(grp,(mbedtls_ecp_point **)&RP,sVar11);
          if (iVar3 != 0) goto LAB_00127666;
          for (bVar10 = 1; bVar10 < bVar8; bVar10 = bVar10 * '\x02') {
            uVar7 = (ulong)bVar10;
            lVar17 = uVar7 + 1;
            pmVar12 = P_00 + (uVar7 - 1);
            R_00 = P_00 + uVar7 * 2 + -1;
            while (lVar17 = lVar17 + -1, lVar17 != 0) {
              iVar3 = ecp_add_mixed(grp,R_00,pmVar12,P_00 + uVar7);
              pmVar12 = pmVar12 + -1;
              R_00 = R_00 + -1;
              if (iVar3 != 0) goto LAB_00127666;
            }
          }
          sVar11 = 0;
          pmVar12 = P_00;
          while( true ) {
            pmVar12 = pmVar12 + 1;
            if ((ulong)uVar5 <= sVar11 + 1) break;
            *(mbedtls_ecp_point **)(&RP.X.s + sVar11 * 2) = pmVar12;
            sVar11 = sVar11 + 1;
          }
          iVar3 = ecp_normalize_jac_many(grp,(mbedtls_ecp_point **)&RP,sVar11);
          if (iVar3 != 0) goto LAB_00127666;
          if (bVar22 != false) {
            grp->T = P_00;
            grp->T_size = (ulong)uVar5;
          }
          goto LAB_0012758e;
        }
        uVar5 = 1 << ((byte)(uVar13 / uVar6) & 0x1f) & 0xff;
        pmVar12 = P_00 + uVar5;
        if ((uVar13 % uVar6 != 0) ||
           (iVar3 = mbedtls_ecp_copy(pmVar12,P_00 + (uVar5 >> 1)), iVar3 == 0)) goto LAB_00127712;
      }
    }
    goto LAB_00127666;
  }
LAB_0012758e:
  iVar3 = mbedtls_mpi_get_bit(&grp->N,0);
  if (iVar3 == 0) {
    iVar3 = -0x4f80;
    goto LAB_00127666;
  }
  mbedtls_mpi_init(&A);
  mbedtls_mpi_init(&AA);
  iVar4 = mbedtls_mpi_get_bit(m,0);
  iVar3 = mbedtls_mpi_copy(&A,m);
  if (((iVar3 == 0) && (iVar3 = mbedtls_mpi_sub_mpi(&AA,&grp->N,m), iVar3 == 0)) &&
     (iVar3 = mbedtls_mpi_safe_cond_assign(&A,&AA,iVar4 == 0), iVar3 == 0)) {
    sVar18 = 1;
    memset(&RP,0,uVar6 + 1);
    for (uVar7 = 0; uVar7 != uVar6; uVar7 = uVar7 + 1) {
      for (uVar13 = 0; uVar15 != uVar13; uVar13 = uVar13 + 1) {
        iVar3 = mbedtls_mpi_get_bit(&A,uVar13 * uVar6 + uVar7);
        pbVar1 = (byte *)((long)&RP.X.s + uVar7);
        *pbVar1 = *pbVar1 | (byte)(iVar3 << ((byte)uVar13 & 0x1f));
      }
    }
    bVar10 = 0;
    for (; uVar6 + 1 != sVar18; sVar18 = sVar18 + 1) {
      bVar20 = *(byte *)((long)&local_150.p + sVar18 + 7);
      bVar2 = *(byte *)((long)&RP.X.s + sVar18);
      bVar14 = bVar2 ^ bVar10;
      bVar9 = (~bVar14 & 1) * bVar20;
      bVar10 = bVar9 & bVar14 | bVar2 & bVar10;
      *(byte *)((long)&RP.X.s + sVar18) = bVar14 ^ bVar9;
      *(byte *)((long)&local_150.p + sVar18 + 7) = ~bVar14 << 7 | bVar20;
    }
    iVar3 = 0;
  }
  mbedtls_mpi_free(&AA);
  mbedtls_mpi_free(&A);
  if (iVar3 != 0) goto LAB_00127666;
  mbedtls_ecp_point_init((mbedtls_ecp_point *)&A);
  iVar3 = ecp_select_comb(grp,R,P_00,bVar8,*(uchar *)((long)&RP.X.s + uVar6));
  if ((iVar3 == 0) && (iVar3 = mbedtls_mpi_lset(&R->Z,1), iVar3 == 0)) {
    if (f_rng == (_func_int_void_ptr_uchar_ptr_size_t *)0x0) {
      iVar3 = 0;
      if (uVar15 <= uVar21) goto LAB_00127ed9;
    }
    else {
      iVar3 = ecp_randomize_jac(grp,R,f_rng,p_rng);
      if (uVar15 <= uVar21 && iVar3 == 0) {
LAB_00127ed9:
        while (iVar3 = ecp_double_jac(grp,R,R), iVar3 == 0) {
          uVar7 = uVar6 - 1;
          iVar3 = ecp_select_comb(grp,(mbedtls_ecp_point *)&A,P_00,bVar8,
                                  *(uchar *)((long)&local_150.p + uVar6 + 7));
          if (((iVar3 != 0) || (iVar3 = ecp_add_mixed(grp,R,R,(mbedtls_ecp_point *)&A), iVar3 != 0))
             || (uVar6 = uVar7, uVar7 == 0)) break;
        }
      }
    }
  }
  mbedtls_ecp_point_free((mbedtls_ecp_point *)&A);
  if (((iVar3 == 0) && (iVar3 = ecp_safe_invert_jac(grp,R,iVar4 == 0), iVar3 == 0)) &&
     ((f_rng == (_func_int_void_ptr_uchar_ptr_size_t *)0x0 ||
      (iVar3 = ecp_randomize_jac(grp,R,f_rng,p_rng), iVar3 == 0)))) {
    iVar3 = ecp_normalize_jac(grp,R);
  }
LAB_00127666:
  if ((P_00 != (mbedtls_ecp_point *)0x0) && (P_00 != grp->T)) {
    for (lVar17 = 0; (ulong)(uVar16 & 0xff) * 0x48 - lVar17 != 0; lVar17 = lVar17 + 0x48) {
      mbedtls_ecp_point_free((mbedtls_ecp_point *)((long)&(P_00->X).s + lVar17));
    }
    free(P_00);
  }
  if (iVar3 == 0) {
    iVar3 = 0;
  }
  else {
    mbedtls_ecp_point_free(R);
  }
  return iVar3;
LAB_00127a82:
  sVar11 = sVar11 - 1;
  if (sVar11 == 0xffffffffffffffff) {
    if (((f_rng == (_func_int_void_ptr_uchar_ptr_size_t *)0x0) ||
        (iVar3 = ecp_randomize_mxz(grp,R,f_rng,p_rng), iVar3 == 0)) &&
       ((iVar3 = mbedtls_mpi_inv_mod(X,X,Y), iVar3 == 0 &&
        (iVar3 = mbedtls_mpi_mul_mod(grp,&R->X,&R->X,X), iVar3 == 0)))) {
      iVar3 = mbedtls_mpi_lset(X,1);
    }
    goto LAB_00127fea;
  }
  iVar3 = mbedtls_mpi_get_bit(m,sVar11);
  swap = (uchar)iVar3;
  iVar3 = mbedtls_mpi_safe_cond_swap(&R->X,&RP.X,swap);
  if ((iVar3 != 0) || (iVar3 = mbedtls_mpi_safe_cond_swap(X,&RP.Z,swap), iVar3 != 0))
  goto LAB_00127fea;
  mbedtls_mpi_init(&A);
  mbedtls_mpi_init(&AA);
  mbedtls_mpi_init(&B);
  mbedtls_mpi_init(&BB);
  mbedtls_mpi_init(&E);
  mbedtls_mpi_init(&C);
  mbedtls_mpi_init(&D);
  mbedtls_mpi_init(&DA);
  mbedtls_mpi_init(&local_1e0);
  iVar3 = mbedtls_mpi_add_mod(grp,&A,&R->X,X);
  if ((iVar3 == 0) &&
     ((iVar3 = mbedtls_mpi_mul_mod(grp,&AA,&A,&A), iVar3 == 0 &&
      (iVar3 = mbedtls_mpi_sub_mod(grp,&B,&R->X,X), iVar3 == 0)))) {
    B_00 = &RP.Z;
    iVar3 = mbedtls_mpi_mul_mod(grp,&BB,&B,&B);
    if ((iVar3 == 0) &&
       ((((((iVar3 = mbedtls_mpi_sub_mod(grp,&E,&AA,&BB), iVar3 == 0 &&
            (iVar3 = mbedtls_mpi_add_mod(grp,&C,&RP.X,B_00), iVar3 == 0)) &&
           (iVar3 = mbedtls_mpi_sub_mod(grp,&D,&RP.X,B_00), iVar3 == 0)) &&
          ((iVar3 = mbedtls_mpi_mul_mod(grp,&DA,&D,&A), iVar3 == 0 &&
           (iVar3 = mbedtls_mpi_mul_mod(grp,&local_1e0,&C,&B), iVar3 == 0)))) &&
         (iVar3 = mbedtls_mpi_add_mpi(&RP.X,&DA,&local_1e0), iVar3 == 0)) &&
        (iVar3 = ecp_modp(&RP.X,grp), iVar3 == 0)))) {
      mul_count = mul_count + 1;
      iVar3 = mbedtls_mpi_mul_mod(grp,&RP.X,&RP.X,&RP.X);
      if ((((iVar3 == 0) && (iVar3 = mbedtls_mpi_sub_mod(grp,B_00,&DA,&local_1e0), iVar3 == 0)) &&
          ((iVar3 = mbedtls_mpi_mul_mod(grp,B_00,B_00,B_00), iVar3 == 0 &&
           (((iVar3 = mbedtls_mpi_mul_mod(grp,B_00,&local_150,B_00), iVar3 == 0 &&
             (iVar3 = mbedtls_mpi_mul_mod(grp,&R->X,&AA,&BB), iVar3 == 0)) &&
            (iVar3 = mbedtls_mpi_mul_mod(grp,X,&grp->A,&E), iVar3 == 0)))))) &&
         (iVar3 = mbedtls_mpi_add_mod(grp,X,&BB,X), iVar3 == 0)) {
        iVar3 = mbedtls_mpi_mul_mod(grp,X,&E,X);
      }
    }
  }
  mbedtls_mpi_free(&A);
  mbedtls_mpi_free(&AA);
  mbedtls_mpi_free(&B);
  mbedtls_mpi_free(&BB);
  mbedtls_mpi_free(&E);
  mbedtls_mpi_free(&C);
  mbedtls_mpi_free(&D);
  mbedtls_mpi_free(&DA);
  mbedtls_mpi_free(&local_1e0);
  if (((iVar3 != 0) || (iVar3 = mbedtls_mpi_safe_cond_swap(&R->X,&RP.X,swap), iVar3 != 0)) ||
     (iVar3 = mbedtls_mpi_safe_cond_swap(X,&RP.Z,swap), iVar3 != 0)) goto LAB_00127fea;
  goto LAB_00127a82;
LAB_00127712:
  iVar3 = ecp_double_jac(grp,pmVar12,pmVar12);
  uVar13 = uVar13 + 1;
  if (iVar3 != 0) goto LAB_00127666;
  goto LAB_001276d1;
}

Assistant:

int mbedtls_ecp_mul_restartable( mbedtls_ecp_group *grp, mbedtls_ecp_point *R,
             const mbedtls_mpi *m, const mbedtls_ecp_point *P,
             int (*f_rng)(void *, unsigned char *, size_t), void *p_rng,
             mbedtls_ecp_restart_ctx *rs_ctx )
{
    int ret = MBEDTLS_ERR_ECP_BAD_INPUT_DATA;
#if defined(MBEDTLS_ECP_INTERNAL_ALT)
    char is_grp_capable = 0;
#endif
    ECP_VALIDATE_RET( grp != NULL );
    ECP_VALIDATE_RET( R   != NULL );
    ECP_VALIDATE_RET( m   != NULL );
    ECP_VALIDATE_RET( P   != NULL );

#if defined(MBEDTLS_ECP_RESTARTABLE)
    /* reset ops count for this call if top-level */
    if( rs_ctx != NULL && rs_ctx->depth++ == 0 )
        rs_ctx->ops_done = 0;
#endif

#if defined(MBEDTLS_ECP_INTERNAL_ALT)
    if( ( is_grp_capable = mbedtls_internal_ecp_grp_capable( grp ) ) )
        MBEDTLS_MPI_CHK( mbedtls_internal_ecp_init( grp ) );
#endif /* MBEDTLS_ECP_INTERNAL_ALT */

#if defined(MBEDTLS_ECP_RESTARTABLE)
    /* skip argument check when restarting */
    if( rs_ctx == NULL || rs_ctx->rsm == NULL )
#endif
    {
        /* check_privkey is free */
        MBEDTLS_ECP_BUDGET( MBEDTLS_ECP_OPS_CHK );

        /* Common sanity checks */
        MBEDTLS_MPI_CHK( mbedtls_ecp_check_privkey( grp, m ) );
        MBEDTLS_MPI_CHK( mbedtls_ecp_check_pubkey( grp, P ) );
    }

    ret = MBEDTLS_ERR_ECP_BAD_INPUT_DATA;
#if defined(ECP_MONTGOMERY)
    if( mbedtls_ecp_get_type( grp ) == MBEDTLS_ECP_TYPE_MONTGOMERY )
        MBEDTLS_MPI_CHK( ecp_mul_mxz( grp, R, m, P, f_rng, p_rng ) );
#endif
#if defined(ECP_SHORTWEIERSTRASS)
    if( mbedtls_ecp_get_type( grp ) == MBEDTLS_ECP_TYPE_SHORT_WEIERSTRASS )
        MBEDTLS_MPI_CHK( ecp_mul_comb( grp, R, m, P, f_rng, p_rng, rs_ctx ) );
#endif

cleanup:

#if defined(MBEDTLS_ECP_INTERNAL_ALT)
    if( is_grp_capable )
        mbedtls_internal_ecp_free( grp );
#endif /* MBEDTLS_ECP_INTERNAL_ALT */

#if defined(MBEDTLS_ECP_RESTARTABLE)
    if( rs_ctx != NULL )
        rs_ctx->depth--;
#endif

    return( ret );
}